

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.h
# Opt level: O3

int __thiscall FTeam::GetTextColor(FTeam *this)

{
  EColorRange EVar1;
  BYTE *pColor;
  BYTE *local_10;
  
  local_10 = (BYTE *)(this->m_TextColor).Chars;
  if (*(int *)(local_10 + -0xc) != 0) {
    EVar1 = V_ParseFontColor(&local_10,0,0);
    if (EVar1 == CR_UNDEFINED) {
      Printf("GetTextColor: Undefined color \'%s\' in definition of team \'%s\'.\n",
             (this->m_TextColor).Chars,(this->m_Name).Chars);
      EVar1 = CR_UNTRANSLATED;
    }
    return EVar1;
  }
  return 0xb;
}

Assistant:

const FStringData *Data() const { return (FStringData *)Chars - 1; }